

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int do_zlib(zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  zhuffman *z;
  zhuffman *z_00;
  char cVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  char *pcVar6;
  uint8 *puVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint8 *puVar15;
  size_t unaff_RBP;
  uint8 uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint8 lencodes [455];
  undefined8 local_218;
  undefined7 uStack_210;
  undefined4 uStack_209;
  byte local_1f9;
  ushort local_1f8;
  ushort local_1f6;
  uint8 auStack_f7 [199];
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar4 = a->zbuffer;
    uVar14 = 0;
    uVar9 = 0;
    if (pbVar4 < a->zbuffer_end) {
      a->zbuffer = pbVar4 + 1;
      uVar9 = (uint)*pbVar4;
    }
    pbVar4 = a->zbuffer;
    if (pbVar4 < a->zbuffer_end) {
      a->zbuffer = pbVar4 + 1;
      uVar14 = (uint)*pbVar4;
    }
    if (((0x8421084 < (uVar9 << 8 | uVar14) * -0x42108421) || ((uVar14 & 0x20) != 0)) ||
       ((uVar9 & 0xf) != 8)) {
LAB_0014a8b7:
      failure_reason = "Corrupt PNG";
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  z_00 = &a->z_distance;
  do {
    if (a->num_bits < 1) {
      fill_bits(a);
    }
    iVar12 = a->num_bits;
    uVar9 = a->code_buffer;
    a->code_buffer = uVar9 >> 1;
    a->num_bits = iVar12 + -1;
    if (iVar12 < 3) {
      fill_bits(a);
    }
    iVar12 = a->num_bits;
    uVar11 = a->code_buffer;
    a->code_buffer = uVar11 >> 2;
    uVar14 = iVar12 - 2;
    a->num_bits = uVar14;
    iVar18 = 0;
    switch(uVar11 & 3) {
    case 0:
      uVar14 = uVar14 & 7;
      if (uVar14 != 0) {
        zreceive(a,uVar14);
      }
      iVar12 = a->num_bits;
      if (iVar12 < 1) {
        uVar13 = 0;
      }
      else {
        uVar14 = a->code_buffer;
        uVar13 = 0;
        iVar18 = iVar12;
        do {
          *(char *)((long)&local_1f8 + uVar13) = (char)uVar14;
          uVar13 = uVar13 + 1;
          uVar14 = uVar14 >> 8;
          iVar12 = iVar18 + -8;
          bVar8 = 8 < iVar18;
          iVar18 = iVar12;
        } while (bVar8);
        a->code_buffer = uVar14;
        a->num_bits = iVar12;
      }
      if (iVar12 != 0) {
        __assert_fail("a->num_bits == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                      ,0x752,"int parse_uncompressed_block(zbuf *)");
      }
      if ((uint)uVar13 < 4) {
        puVar15 = a->zbuffer;
        puVar7 = a->zbuffer_end;
        uVar13 = uVar13 & 0xffffffff;
        do {
          if (puVar15 < puVar7) {
            a->zbuffer = puVar15 + 1;
            uVar16 = *puVar15;
            puVar15 = puVar15 + 1;
          }
          else {
            uVar16 = '\0';
          }
          *(uint8 *)((long)&local_1f8 + uVar13) = uVar16;
          uVar13 = uVar13 + 1;
        } while (uVar13 != 4);
      }
      if (((local_1f6 ^ local_1f8) != 0xffff) ||
         (uVar13 = (ulong)local_1f8, a->zbuffer_end < a->zbuffer + uVar13)) {
        failure_reason = "Corrupt PNG";
        return 0;
      }
      if ((a->zout_end < a->zout + uVar13) && (iVar12 = expand(a,(uint)local_1f8), iVar12 == 0)) {
        return 0;
      }
      memcpy(a->zout,a->zbuffer,uVar13);
      a->zbuffer = a->zbuffer + uVar13;
      a->zout = a->zout + uVar13;
      goto LAB_0014a8a5;
    case 1:
      if (default_distance[0x1f] == '\0') {
        memset(default_length,8,0x90);
        builtin_memcpy(default_length + 0x90,
                       "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                       ,0x90);
        builtin_memcpy(default_distance,
                       "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                       ,0x20);
      }
      iVar12 = zbuild_huffman(z,default_length,0x120);
      if (iVar12 == 0) {
        return 0;
      }
      iVar12 = zbuild_huffman(z_00,default_distance,0x20);
      break;
    case 2:
      if (iVar12 < 7) {
        fill_bits(a);
      }
      iVar12 = a->num_bits;
      uVar14 = a->code_buffer;
      a->code_buffer = uVar14 >> 5;
      a->num_bits = iVar12 + -5;
      if (iVar12 < 10) {
        fill_bits(a);
      }
      iVar12 = a->num_bits;
      uVar11 = a->code_buffer;
      a->code_buffer = uVar11 >> 5;
      a->num_bits = iVar12 + -5;
      if (iVar12 < 9) {
        fill_bits(a);
      }
      uVar14 = uVar14 & 0x1f;
      iVar12 = uVar14 + 0x101;
      iVar18 = (uVar11 & 0x1f) + 1;
      uVar11 = a->code_buffer;
      a->code_buffer = uVar11 >> 4;
      a->num_bits = a->num_bits + -4;
      local_218 = 0;
      uStack_210 = 0;
      uStack_209 = 0;
      lVar17 = 0;
      do {
        if (a->num_bits < 3) {
          fill_bits(a);
        }
        uVar2 = a->code_buffer;
        a->code_buffer = uVar2 >> 3;
        a->num_bits = a->num_bits + -3;
        *(byte *)((long)&local_218 + (ulong)(byte)(&compute_huffman_codes_length_dezigzag)[lVar17])
             = (byte)uVar2 & 7;
        lVar17 = lVar17 + 1;
      } while ((ulong)(uVar11 & 0xf) + 4 != lVar17);
      iVar10 = zbuild_huffman((zhuffman *)compute_huffman_codes_z_codelength,(uint8 *)&local_218,
                              0x13);
      if (iVar10 == 0) {
        return 0;
      }
      iVar19 = iVar18 + iVar12;
      iVar10 = 0;
      do {
        uVar11 = zhuffman_decode(a,(zhuffman *)compute_huffman_codes_z_codelength);
        if (0x12 < uVar11) {
          __assert_fail("c >= 0 && c < 19",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                        ,0x72d,"int compute_huffman_codes(zbuf *)");
        }
        if ((int)uVar11 < 0x10) {
          lVar17 = (long)iVar10;
          iVar10 = iVar10 + 1;
          *(char *)((long)&local_1f8 + lVar17) = (char)uVar11;
        }
        else {
          iVar3 = a->num_bits;
          if (uVar11 == 0x11) {
            if (iVar3 < 3) {
              fill_bits(a);
            }
            uVar11 = a->code_buffer;
            a->code_buffer = uVar11 >> 3;
            a->num_bits = a->num_bits + -3;
            unaff_RBP = (ulong)(uVar11 & 7) + 3;
LAB_0014a646:
            uVar11 = 0;
          }
          else {
            if (uVar11 != 0x10) {
              if (iVar3 < 7) {
                fill_bits(a);
              }
              uVar11 = a->code_buffer;
              a->code_buffer = uVar11 >> 7;
              a->num_bits = a->num_bits + -7;
              unaff_RBP = (ulong)(uVar11 & 0x7f) + 0xb;
              goto LAB_0014a646;
            }
            if (iVar3 < 2) {
              fill_bits(a);
            }
            uVar11 = a->code_buffer;
            a->code_buffer = uVar11 >> 2;
            a->num_bits = a->num_bits + -2;
            unaff_RBP = (ulong)(uVar11 & 3) + 3;
            uVar11 = (uint)(&local_1f9)[iVar10];
          }
          memset((void *)((long)&local_1f8 + (long)iVar10),uVar11,unaff_RBP);
          iVar10 = iVar10 + (int)unaff_RBP;
        }
      } while (iVar10 < iVar19);
      if (iVar10 != iVar19) goto LAB_0014a8b7;
      iVar12 = zbuild_huffman(z,(uint8 *)&local_1f8,iVar12);
      if (iVar12 == 0) {
        return 0;
      }
      iVar12 = zbuild_huffman(z_00,auStack_f7 + uVar14,iVar18);
      break;
    case 3:
      goto switchD_0014a37c_caseD_3;
    }
    if (iVar12 == 0) {
      default_distance[0] = (uint8)default_distance._0_8_;
      default_distance[1] = SUB81(default_distance._0_8_,1);
      default_distance[2] = SUB81(default_distance._0_8_,2);
      default_distance[3] = SUB81(default_distance._0_8_,3);
      default_distance[4] = SUB81(default_distance._0_8_,4);
      default_distance[5] = SUB81(default_distance._0_8_,5);
      default_distance[6] = SUB81(default_distance._0_8_,6);
      default_distance[7] = SUB81(default_distance._0_8_,7);
      default_distance[8] = (uint8)default_distance._8_8_;
      default_distance[9] = SUB81(default_distance._8_8_,1);
      default_distance[10] = SUB81(default_distance._8_8_,2);
      default_distance[0xb] = SUB81(default_distance._8_8_,3);
      default_distance[0xc] = SUB81(default_distance._8_8_,4);
      default_distance[0xd] = SUB81(default_distance._8_8_,5);
      default_distance[0xe] = SUB81(default_distance._8_8_,6);
      default_distance[0xf] = SUB81(default_distance._8_8_,7);
      default_distance[0x10] = (uint8)default_distance._16_8_;
      default_distance[0x11] = SUB81(default_distance._16_8_,1);
      default_distance[0x12] = SUB81(default_distance._16_8_,2);
      default_distance[0x13] = SUB81(default_distance._16_8_,3);
      default_distance[0x14] = SUB81(default_distance._16_8_,4);
      default_distance[0x15] = SUB81(default_distance._16_8_,5);
      default_distance[0x16] = SUB81(default_distance._16_8_,6);
      default_distance[0x17] = SUB81(default_distance._16_8_,7);
      default_distance[0x18] = (uint8)default_distance._24_8_;
      default_distance[0x19] = SUB81(default_distance._24_8_,1);
      default_distance[0x1a] = SUB81(default_distance._24_8_,2);
      default_distance[0x1b] = SUB81(default_distance._24_8_,3);
      default_distance[0x1c] = SUB81(default_distance._24_8_,4);
      default_distance[0x1d] = SUB81(default_distance._24_8_,5);
      default_distance[0x1e] = SUB81(default_distance._24_8_,6);
      default_distance[0x1f] = SUB81(default_distance._24_8_,7);
      default_length[0x90] = (uint8)default_length._144_8_;
      default_length[0x91] = SUB81(default_length._144_8_,1);
      default_length[0x92] = SUB81(default_length._144_8_,2);
      default_length[0x93] = SUB81(default_length._144_8_,3);
      default_length[0x94] = SUB81(default_length._144_8_,4);
      default_length[0x95] = SUB81(default_length._144_8_,5);
      default_length[0x96] = SUB81(default_length._144_8_,6);
      default_length[0x97] = SUB81(default_length._144_8_,7);
      default_length[0x98] = (uint8)default_length._152_8_;
      default_length[0x99] = SUB81(default_length._152_8_,1);
      default_length[0x9a] = SUB81(default_length._152_8_,2);
      default_length[0x9b] = SUB81(default_length._152_8_,3);
      default_length[0x9c] = SUB81(default_length._152_8_,4);
      default_length[0x9d] = SUB81(default_length._152_8_,5);
      default_length[0x9e] = SUB81(default_length._152_8_,6);
      default_length[0x9f] = SUB81(default_length._152_8_,7);
      default_length[0xa0] = (uint8)default_length._160_8_;
      default_length[0xa1] = SUB81(default_length._160_8_,1);
      default_length[0xa2] = SUB81(default_length._160_8_,2);
      default_length[0xa3] = SUB81(default_length._160_8_,3);
      default_length[0xa4] = SUB81(default_length._160_8_,4);
      default_length[0xa5] = SUB81(default_length._160_8_,5);
      default_length[0xa6] = SUB81(default_length._160_8_,6);
      default_length[0xa7] = SUB81(default_length._160_8_,7);
      default_length[0xa8] = (uint8)default_length._168_8_;
      default_length[0xa9] = SUB81(default_length._168_8_,1);
      default_length[0xaa] = SUB81(default_length._168_8_,2);
      default_length[0xab] = SUB81(default_length._168_8_,3);
      default_length[0xac] = SUB81(default_length._168_8_,4);
      default_length[0xad] = SUB81(default_length._168_8_,5);
      default_length[0xae] = SUB81(default_length._168_8_,6);
      default_length[0xaf] = SUB81(default_length._168_8_,7);
      default_length[0xb0] = (uint8)default_length._176_8_;
      default_length[0xb1] = SUB81(default_length._176_8_,1);
      default_length[0xb2] = SUB81(default_length._176_8_,2);
      default_length[0xb3] = SUB81(default_length._176_8_,3);
      default_length[0xb4] = SUB81(default_length._176_8_,4);
      default_length[0xb5] = SUB81(default_length._176_8_,5);
      default_length[0xb6] = SUB81(default_length._176_8_,6);
      default_length[0xb7] = SUB81(default_length._176_8_,7);
      default_length[0xb8] = (uint8)default_length._184_8_;
      default_length[0xb9] = SUB81(default_length._184_8_,1);
      default_length[0xba] = SUB81(default_length._184_8_,2);
      default_length[0xbb] = SUB81(default_length._184_8_,3);
      default_length[0xbc] = SUB81(default_length._184_8_,4);
      default_length[0xbd] = SUB81(default_length._184_8_,5);
      default_length[0xbe] = SUB81(default_length._184_8_,6);
      default_length[0xbf] = SUB81(default_length._184_8_,7);
      default_length[0xc0] = (uint8)default_length._192_8_;
      default_length[0xc1] = SUB81(default_length._192_8_,1);
      default_length[0xc2] = SUB81(default_length._192_8_,2);
      default_length[0xc3] = SUB81(default_length._192_8_,3);
      default_length[0xc4] = SUB81(default_length._192_8_,4);
      default_length[0xc5] = SUB81(default_length._192_8_,5);
      default_length[0xc6] = SUB81(default_length._192_8_,6);
      default_length[199] = SUB81(default_length._192_8_,7);
      default_length[200] = (uint8)default_length._200_8_;
      default_length[0xc9] = SUB81(default_length._200_8_,1);
      default_length[0xca] = SUB81(default_length._200_8_,2);
      default_length[0xcb] = SUB81(default_length._200_8_,3);
      default_length[0xcc] = SUB81(default_length._200_8_,4);
      default_length[0xcd] = SUB81(default_length._200_8_,5);
      default_length[0xce] = SUB81(default_length._200_8_,6);
      default_length[0xcf] = SUB81(default_length._200_8_,7);
      default_length[0xd0] = (uint8)default_length._208_8_;
      default_length[0xd1] = SUB81(default_length._208_8_,1);
      default_length[0xd2] = SUB81(default_length._208_8_,2);
      default_length[0xd3] = SUB81(default_length._208_8_,3);
      default_length[0xd4] = SUB81(default_length._208_8_,4);
      default_length[0xd5] = SUB81(default_length._208_8_,5);
      default_length[0xd6] = SUB81(default_length._208_8_,6);
      default_length[0xd7] = SUB81(default_length._208_8_,7);
      default_length[0xd8] = (uint8)default_length._216_8_;
      default_length[0xd9] = SUB81(default_length._216_8_,1);
      default_length[0xda] = SUB81(default_length._216_8_,2);
      default_length[0xdb] = SUB81(default_length._216_8_,3);
      default_length[0xdc] = SUB81(default_length._216_8_,4);
      default_length[0xdd] = SUB81(default_length._216_8_,5);
      default_length[0xde] = SUB81(default_length._216_8_,6);
      default_length[0xdf] = SUB81(default_length._216_8_,7);
      default_length[0xe0] = (uint8)default_length._224_8_;
      default_length[0xe1] = SUB81(default_length._224_8_,1);
      default_length[0xe2] = SUB81(default_length._224_8_,2);
      default_length[0xe3] = SUB81(default_length._224_8_,3);
      default_length[0xe4] = SUB81(default_length._224_8_,4);
      default_length[0xe5] = SUB81(default_length._224_8_,5);
      default_length[0xe6] = SUB81(default_length._224_8_,6);
      default_length[0xe7] = SUB81(default_length._224_8_,7);
      default_length[0xe8] = (uint8)default_length._232_8_;
      default_length[0xe9] = SUB81(default_length._232_8_,1);
      default_length[0xea] = SUB81(default_length._232_8_,2);
      default_length[0xeb] = SUB81(default_length._232_8_,3);
      default_length[0xec] = SUB81(default_length._232_8_,4);
      default_length[0xed] = SUB81(default_length._232_8_,5);
      default_length[0xee] = SUB81(default_length._232_8_,6);
      default_length[0xef] = SUB81(default_length._232_8_,7);
      default_length[0xf0] = (uint8)default_length._240_8_;
      default_length[0xf1] = SUB81(default_length._240_8_,1);
      default_length[0xf2] = SUB81(default_length._240_8_,2);
      default_length[0xf3] = SUB81(default_length._240_8_,3);
      default_length[0xf4] = SUB81(default_length._240_8_,4);
      default_length[0xf5] = SUB81(default_length._240_8_,5);
      default_length[0xf6] = SUB81(default_length._240_8_,6);
      default_length[0xf7] = SUB81(default_length._240_8_,7);
      default_length[0xf8] = (uint8)default_length._248_8_;
      default_length[0xf9] = SUB81(default_length._248_8_,1);
      default_length[0xfa] = SUB81(default_length._248_8_,2);
      default_length[0xfb] = SUB81(default_length._248_8_,3);
      default_length[0xfc] = SUB81(default_length._248_8_,4);
      default_length[0xfd] = SUB81(default_length._248_8_,5);
      default_length[0xfe] = SUB81(default_length._248_8_,6);
      default_length[0xff] = SUB81(default_length._248_8_,7);
      default_length[0x100] = (uint8)default_length._256_8_;
      default_length[0x101] = SUB81(default_length._256_8_,1);
      default_length[0x102] = SUB81(default_length._256_8_,2);
      default_length[0x103] = SUB81(default_length._256_8_,3);
      default_length[0x104] = SUB81(default_length._256_8_,4);
      default_length[0x105] = SUB81(default_length._256_8_,5);
      default_length[0x106] = SUB81(default_length._256_8_,6);
      default_length[0x107] = SUB81(default_length._256_8_,7);
      default_length[0x108] = (uint8)default_length._264_8_;
      default_length[0x109] = SUB81(default_length._264_8_,1);
      default_length[0x10a] = SUB81(default_length._264_8_,2);
      default_length[0x10b] = SUB81(default_length._264_8_,3);
      default_length[0x10c] = SUB81(default_length._264_8_,4);
      default_length[0x10d] = SUB81(default_length._264_8_,5);
      default_length[0x10e] = SUB81(default_length._264_8_,6);
      default_length[0x10f] = SUB81(default_length._264_8_,7);
      default_length[0x110] = (uint8)default_length._272_8_;
      default_length[0x111] = SUB81(default_length._272_8_,1);
      default_length[0x112] = SUB81(default_length._272_8_,2);
      default_length[0x113] = SUB81(default_length._272_8_,3);
      default_length[0x114] = SUB81(default_length._272_8_,4);
      default_length[0x115] = SUB81(default_length._272_8_,5);
      default_length[0x116] = SUB81(default_length._272_8_,6);
      default_length[0x117] = SUB81(default_length._272_8_,7);
      default_length[0x118] = (uint8)default_length._280_8_;
      default_length[0x119] = SUB81(default_length._280_8_,1);
      default_length[0x11a] = SUB81(default_length._280_8_,2);
      default_length[0x11b] = SUB81(default_length._280_8_,3);
      default_length[0x11c] = SUB81(default_length._280_8_,4);
      default_length[0x11d] = SUB81(default_length._280_8_,5);
      default_length[0x11e] = SUB81(default_length._280_8_,6);
      default_length[0x11f] = SUB81(default_length._280_8_,7);
      return 0;
    }
    do {
      iVar12 = zhuffman_decode(a,z);
      if (iVar12 < 0x100) {
        if (iVar12 < 0) {
LAB_0014a79a:
          failure_reason = "Corrupt PNG";
LAB_0014a7a1:
          unaff_RBP = 0;
          goto LAB_0014a7a3;
        }
        if ((a->zout_end <= a->zout) && (iVar18 = expand(a,1), iVar18 == 0)) goto LAB_0014a7a1;
        pcVar5 = a->zout;
        a->zout = pcVar5 + 1;
        *pcVar5 = (char)iVar12;
        bVar8 = true;
      }
      else {
        if (iVar12 != 0x100) {
          uVar13 = (ulong)(iVar12 - 0x101);
          iVar12 = length_base[uVar13];
          if (0xffffffffffffffeb < uVar13 - 0x1c) {
            uVar14 = zreceive(a,length_extra[uVar13]);
            iVar12 = iVar12 + uVar14;
          }
          uVar14 = zhuffman_decode(a,z_00);
          if (-1 < (int)uVar14) {
            uVar13 = (ulong)uVar14;
            iVar18 = dist_base[uVar13];
            if (0xffffffffffffffe5 < uVar13 - 0x1e) {
              uVar14 = zreceive(a,dist_extra[uVar13]);
              iVar18 = iVar18 + uVar14;
            }
            if ((long)iVar18 <= (long)a->zout - (long)a->zout_start) {
              if ((a->zout_end < a->zout + iVar12) && (iVar10 = expand(a,iVar12), iVar10 == 0)) {
                unaff_RBP = 0;
                bVar8 = false;
              }
              else {
                bVar8 = true;
                if (iVar12 != 0) {
                  pcVar5 = a->zout;
                  lVar17 = 0;
                  do {
                    cVar1 = pcVar5[lVar17 - iVar18];
                    pcVar6 = a->zout;
                    a->zout = pcVar6 + 1;
                    *pcVar6 = cVar1;
                    lVar17 = lVar17 + 1;
                  } while (iVar12 != (int)lVar17);
                }
              }
              goto LAB_0014a7a5;
            }
          }
          goto LAB_0014a79a;
        }
        unaff_RBP = 1;
LAB_0014a7a3:
        bVar8 = false;
      }
LAB_0014a7a5:
    } while (bVar8);
    if ((int)unaff_RBP == 0) {
      return 0;
    }
LAB_0014a8a5:
  } while ((uVar9 & 1) == 0);
  iVar18 = 1;
switchD_0014a37c_caseD_3:
  return iVar18;
}

Assistant:

static int do_zlib(zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return parse_zlib(a, parse_header);
}